

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

void freeErrorStates(void)

{
  __PHYSFS_ERRSTATETYPE__ *p_Var1;
  ErrState *next;
  ErrState *i;
  
  next = errorStates;
  while (next != (ErrState *)0x0) {
    p_Var1 = next->next;
    (*__PHYSFS_AllocatorHooks.Free)(next);
    next = p_Var1;
  }
  errorStates = (ErrState *)0x0;
  return;
}

Assistant:

static void freeErrorStates(void)
{
    ErrState *i;
    ErrState *next;

    for (i = errorStates; i != NULL; i = next)
    {
        next = i->next;
        allocator.Free(i);
    } /* for */

    errorStates = NULL;
}